

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O2

uint __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::get_dimension_of_a_cell
          (Bitmap_cubical_complex_base<double> *this,size_t cell)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  puVar2 = (this->multipliers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar4 = 0;
  for (uVar5 = (long)(this->multipliers).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar2 >> 2; 1 < uVar5;
      uVar5 = uVar5 - 1) {
    uVar1 = puVar2[uVar5 - 1];
    uVar3 = cell / uVar1;
    cell = cell % (ulong)uVar1;
    iVar4 = ((uint)uVar3 & 1) + iVar4;
  }
  return ((uint)cell & 1) + iVar4;
}

Assistant:

unsigned Bitmap_cubical_complex_base<T>::get_dimension_of_a_cell(std::size_t cell) const {
#ifdef DEBUG_TRACES
  std::clog << "\n\n\n Computing position o a cell of an index : " << cell << std::endl;
#endif
  unsigned dimension = 0;
  for (std::size_t i = this->multipliers.size(); i > 1; --i) {
    unsigned position = cell / this->multipliers[i - 1];
    std::size_t newcell = cell % this->multipliers[i - 1];

#ifdef DEBUG_TRACES
    std::clog << "i-1 :" << i - 1 << std::endl;
    std::clog << "cell : " << cell << std::endl;
    std::clog << "position : " << position << std::endl;
    std::clog << "multipliers[" << i - 1 << "] = " << this->multipliers[i - 1] << std::endl;
#endif

    if (position % 2 == 1) {
#ifdef DEBUG_TRACES
      std::clog << "Nonzero length in this direction \n";
#endif
      dimension++;
    }
    cell = newcell;
  }
  // Split out the last iteration to save a costly division by multipliers[0]=1
#ifdef DEBUG_TRACES
  std::clog << "i-1 :" << 0 << std::endl;
  std::clog << "cell : " << cell << std::endl;
  std::clog << "position : " << cell << std::endl;
  std::clog << "multipliers[" << 0 << "] = " << 1 << std::endl;
#endif

  if (cell % 2 == 1) {
#ifdef DEBUG_TRACES
    std::clog << "Nonzero length in this direction \n";
#endif
    dimension++;
  }

  return dimension;
}